

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xrespondent.c
# Opt level: O0

int nn_xrespondent_recv(nn_sockbase *self,nn_msg *msg)

{
  uint32_t uVar1;
  char *pcVar2;
  size_t sVar3;
  void *pvVar4;
  nn_chunkref *pnVar5;
  uint8_t *buf;
  nn_chunkref *in_RSI;
  nn_msg *in_RDI;
  int maxttl;
  nn_xrespondent_data *pipedata;
  nn_chunkref ref;
  void *data;
  size_t sz;
  int i;
  nn_pipe *pipe;
  nn_xrespondent *xrespondent;
  int rc;
  size_t *in_stack_ffffffffffffff68;
  nn_chunkref *in_stack_ffffffffffffff70;
  nn_chunkref *in_stack_ffffffffffffff78;
  FILE *__stream;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  nn_chunkref *in_stack_ffffffffffffff90;
  nn_chunkref local_68;
  void *local_48;
  ulong local_40;
  int local_34;
  nn_pipe *local_30;
  nn_msg *local_28;
  uint local_1c;
  nn_chunkref *local_18;
  uint local_4;
  
  if (in_RDI == (nn_msg *)0x0) {
    in_RDI = (nn_msg *)0x0;
  }
  local_28 = in_RDI;
  local_18 = in_RSI;
  local_1c = nn_fq_recv((nn_fq *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                        in_RDI,(nn_pipe **)in_stack_ffffffffffffff78);
  local_4 = local_1c;
  if (-1 < (int)local_1c) {
    if ((local_1c & 2) == 0) {
      local_40 = 4;
      local_1c = nn_sockbase_getopt((nn_sockbase *)in_RDI,
                                    (int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                                    in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      if (local_1c != 0) {
        nn_backtrace_print();
        __stream = _stderr;
        pcVar2 = nn_err_strerror((int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
        fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar2,(ulong)-local_1c,
                "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/survey/xrespondent.c"
                ,0xd5);
        fflush(_stderr);
        nn_err_abort();
      }
      local_48 = nn_chunkref_data(local_18 + 2);
      local_40 = nn_chunkref_size(in_stack_ffffffffffffff70);
      for (local_34 = 0; (ulong)((long)(local_34 + 1) * 4) <= local_40; local_34 = local_34 + 1) {
        uVar1 = nn_getl((uint8_t *)((long)local_48 + (long)local_34 * 4));
        if ((uVar1 & 0x80000000) != 0) {
          local_34 = local_34 + 1;
          if (in_stack_ffffffffffffff8c < local_34) {
            nn_msg_term((nn_msg *)0x1ddcba);
            return -0xb;
          }
          sVar3 = nn_chunkref_size(in_stack_ffffffffffffff70);
          if (sVar3 != 0) {
            nn_backtrace_print();
            fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","nn_chunkref_size (&msg->sphdr) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/survey/xrespondent.c"
                    ,0xf1);
            fflush(_stderr);
            nn_err_abort();
          }
          nn_chunkref_term(in_stack_ffffffffffffff70);
          nn_chunkref_init(in_stack_ffffffffffffff90,
                           CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
          pvVar4 = nn_chunkref_data(local_18);
          memcpy(pvVar4,local_48,(long)local_34 << 2);
          nn_chunkref_trim(in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68);
          goto LAB_001ddd96;
        }
      }
      nn_msg_term((nn_msg *)0x1ddc59);
      local_4 = 0xfffffff5;
    }
    else {
LAB_001ddd96:
      pnVar5 = (nn_chunkref *)nn_pipe_getdata(local_30);
      nn_chunkref_size(in_stack_ffffffffffffff70);
      nn_chunkref_init(pnVar5,CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      buf = (uint8_t *)nn_chunkref_data(&local_68);
      nn_putl(buf,*(uint32_t *)((long)&pnVar5->u + 8));
      pvVar4 = nn_chunkref_data(&local_68);
      pvVar4 = (void *)((long)pvVar4 + 4);
      pnVar5 = (nn_chunkref *)nn_chunkref_data(local_18);
      sVar3 = nn_chunkref_size(pnVar5);
      memcpy(pvVar4,pnVar5,sVar3);
      nn_chunkref_term(pnVar5);
      nn_chunkref_mv(&in_RDI->sphdr,in_stack_ffffffffffffff78);
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int nn_xrespondent_recv (struct nn_sockbase *self, struct nn_msg *msg)
{
    int rc;
    struct nn_xrespondent *xrespondent;
    struct nn_pipe *pipe;
    int i;
    size_t sz;
    void *data;
    struct nn_chunkref ref;
    struct nn_xrespondent_data *pipedata;
    int maxttl;

    xrespondent = nn_cont (self, struct nn_xrespondent, sockbase);

    rc = nn_fq_recv (&xrespondent->inpipes, msg, &pipe);
    if (nn_slow (rc < 0))
        return rc;

    /*  Split the header (including survey ID) from the body, if needed. */
    if (!(rc & NN_PIPE_PARSED)) {

        sz = sizeof (maxttl);
        rc = nn_sockbase_getopt (self, NN_MAXTTL, &maxttl, &sz);
        errnum_assert (rc == 0, -rc);

        /*  Determine the size of the message header. */
        data = nn_chunkref_data (&msg->body);
        sz = nn_chunkref_size (&msg->body);
        i = 0;

        while (1) {
	    /*  Ignore the malformed surveys without the bottom of the stack. */
	    if (nn_slow ((i + 1) * sizeof (uint32_t) > sz)) {
                nn_msg_term (msg);
                return -EAGAIN;
            }

            /*  If the bottom of the backtrace stack is reached, proceed. */
            if (nn_getl ((uint8_t*)(((uint32_t*) data) + i)) & 0x80000000)
                break;

            ++i;
        }
        ++i;
    
        /*  Ignore messages with too many hops. */
        if (i > maxttl) {
            nn_msg_term (msg);
            return -EAGAIN;
        }

        nn_assert (nn_chunkref_size (&msg->sphdr) == 0);
        nn_chunkref_term (&msg->sphdr);
        nn_chunkref_init (&msg->sphdr, i * sizeof (uint32_t));
        memcpy (nn_chunkref_data (&msg->sphdr), data, i * sizeof (uint32_t));
        nn_chunkref_trim (&msg->body, i * sizeof (uint32_t));
    }

    /*  Prepend the header by the pipe key. */
    pipedata = nn_pipe_getdata (pipe);
    nn_chunkref_init (&ref, nn_chunkref_size (&msg->sphdr) + sizeof (uint32_t));
    nn_putl (nn_chunkref_data (&ref), pipedata->outitem.key);
    memcpy (((uint8_t *) nn_chunkref_data (&ref)) + sizeof (uint32_t),
        nn_chunkref_data (&msg->sphdr), nn_chunkref_size (&msg->sphdr));
    nn_chunkref_term (&msg->sphdr);
    nn_chunkref_mv (&msg->sphdr, &ref);

    return 0;
}